

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vsx-impl.inc.c
# Opt level: O1

void gen_xvcmpgtsp(DisasContext_conflict10 *ctx)

{
  uint uVar1;
  TCGContext_conflict10 *s;
  TCGTemp *pTVar2;
  uintptr_t o_2;
  TCGv_i64 ret;
  uintptr_t o;
  TCGv_i64 ret_00;
  uintptr_t o_1;
  TCGv_i64 ret_01;
  TCGTemp *args [1];
  TCGTemp *local_58;
  TCGv_i64 local_50;
  TCGv_i64 local_48;
  TCGv_i64 local_40;
  
  if (ctx->vsx_enabled != false) {
    s = ctx->uc->tcg_ctx;
    uVar1 = ctx->opcode;
    pTVar2 = tcg_temp_new_internal_ppc64(s,TCG_TYPE_I64,false);
    ret_00 = (TCGv_i64)((long)pTVar2 - (long)s);
    tcg_gen_addi_i64_ppc64
              (s,ret_00,(TCGv_i64)s->cpu_env,
               (ulong)((uVar1 >> 0x15 & 0x1f | (uVar1 & 1) << 5) * 0x10 + 0x12b20));
    uVar1 = ctx->opcode;
    pTVar2 = tcg_temp_new_internal_ppc64(s,TCG_TYPE_I64,false);
    ret_01 = (TCGv_i64)((long)pTVar2 - (long)s);
    tcg_gen_addi_i64_ppc64
              (s,ret_01,(TCGv_i64)s->cpu_env,
               (ulong)(((uVar1 >> 0x10 & 0x1f) + (uVar1 & 4) * 8) * 0x10 + 0x12b20));
    uVar1 = ctx->opcode;
    pTVar2 = tcg_temp_new_internal_ppc64(s,TCG_TYPE_I64,false);
    ret = (TCGv_i64)((long)pTVar2 - (long)s);
    tcg_gen_addi_i64_ppc64
              (s,ret,(TCGv_i64)s->cpu_env,
               (ulong)((uVar1 >> 0xb & 0x1f | (uVar1 & 2) << 4) * 0x10 + 0x12b20));
    if ((ctx->opcode & 0x400) == 0) {
      pTVar2 = tcg_temp_new_internal_ppc64(s,TCG_TYPE_I32,false);
      local_58 = (TCGTemp *)(s->cpu_env + (long)s);
      local_50 = (TCGv_i64)((long)s + (long)ret_00);
      local_48 = (TCGv_i64)((long)s + (long)ret_01);
      local_40 = (TCGv_i64)((long)s + (long)ret);
      tcg_gen_callN_ppc64(s,helper_xvcmpgtsp,pTVar2,4,&local_58);
      tcg_temp_free_internal_ppc64(s,pTVar2);
    }
    else {
      local_58 = (TCGTemp *)(s->cpu_env + (long)s);
      local_50 = (TCGv_i64)((long)s + (long)ret_00);
      local_48 = (TCGv_i64)((long)s + (long)ret_01);
      local_40 = (TCGv_i64)((long)s + (long)ret);
      tcg_gen_callN_ppc64(s,helper_xvcmpgtsp,(TCGTemp *)(cpu_crf[6] + (long)s),4,&local_58);
    }
    local_58 = (TCGTemp *)(s->cpu_env + (long)s);
    tcg_gen_callN_ppc64(s,helper_float_check_status,(TCGTemp *)0x0,1,&local_58);
    tcg_temp_free_internal_ppc64(s,(TCGTemp *)(ret_00 + (long)s));
    tcg_temp_free_internal_ppc64(s,(TCGTemp *)(ret_01 + (long)s));
    tcg_temp_free_internal_ppc64(s,(TCGTemp *)(ret + (long)s));
    return;
  }
  gen_exception(ctx,0x5e);
  return;
}

Assistant:

static void gen_xscvqpdp(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv_i32 opc;
    TCGv_ptr xt, xb;
    if (unlikely(!ctx->vsx_enabled)) {
        gen_exception(ctx, POWERPC_EXCP_VSXU);
        return;
    }
    opc = tcg_const_i32(tcg_ctx, ctx->opcode);
    xt = gen_vsr_ptr(tcg_ctx, xT(ctx->opcode));
    xb = gen_vsr_ptr(tcg_ctx, xB(ctx->opcode));
    gen_helper_xscvqpdp(tcg_ctx, tcg_ctx->cpu_env, opc, xt, xb);
    tcg_temp_free_i32(tcg_ctx, opc);
    tcg_temp_free_ptr(tcg_ctx, xt);
    tcg_temp_free_ptr(tcg_ctx, xb);
}